

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> __thiscall
duckdb::HyperLogLog::Deserialize(HyperLogLog *this,Deserializer *deserializer)

{
  data_ptr_t ret;
  HLLStorageType HVar1;
  pointer ret_00;
  pointer pHVar2;
  uint64_t count;
  type new_hll;
  SerializationException *this_00;
  allocator local_41;
  templated_unique_single_t old;
  
  make_uniq<duckdb::HyperLogLog>();
  HVar1 = Deserializer::ReadProperty<duckdb::HLLStorageType>(deserializer,100,"type");
  if (HVar1 == HLL_V1) {
    make_uniq<duckdb::HLLV1>();
    pHVar2 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    ret = (data_ptr_t)pHVar2->hll->ptr;
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    count = duckdb_hll::get_size();
    Deserializer::ReadProperty(deserializer,0x65,"data",ret,count);
    pHVar2 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->(&old);
    new_hll = unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
              operator*((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                         *)this);
    HLLV1::ToNew(pHVar2,new_hll);
    ::std::unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_>::~unique_ptr
              (&old.super_unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_>);
  }
  else {
    if (HVar1 != HLL_V2) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&old,"Unknown HyperLogLog storage type!",&local_41);
      SerializationException::SerializationException(this_00,(string *)&old);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ret_00 = unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
             operator->((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                         *)this);
    Deserializer::ReadProperty(deserializer,0x65,"data",ret_00->k,0x40);
  }
  return (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)this;
}

Assistant:

unique_ptr<HyperLogLog> HyperLogLog::Deserialize(Deserializer &deserializer) {
	auto result = make_uniq<HyperLogLog>();
	auto storage_type = deserializer.ReadProperty<HLLStorageType>(100, "type");
	switch (storage_type) {
	case HLLStorageType::HLL_V1: {
		auto old = make_uniq<HLLV1>();
		deserializer.ReadProperty(101, "data", old->GetPtr(), old->GetSize());
		old->ToNew(*result);
		break;
	}
	case HLLStorageType::HLL_V2:
		deserializer.ReadProperty(101, "data", result->k, sizeof(k));
		break;
	default:
		throw SerializationException("Unknown HyperLogLog storage type!");
	}
	return result;
}